

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O0

void __thiscall Company::Company(Company *this,Company *obj)

{
  undefined1 auVar1 [16];
  int iVar2;
  Boss *this_00;
  ulong uVar3;
  Employee **ppEVar4;
  Employee *this_01;
  int local_28;
  int i;
  Company *obj_local;
  Company *this_local;
  
  this->budget = obj->budget;
  this_00 = (Boss *)operator_new(0xc0);
  Boss::Boss(this_00,obj->boss);
  this->boss = this_00;
  iVar2 = Boss::getNumberOfEmployees(obj->boss);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppEVar4 = (Employee **)operator_new__(uVar3);
  this->employees = ppEVar4;
  local_28 = 0;
  while( true ) {
    iVar2 = Boss::getNumberOfEmployees(obj->boss);
    if (iVar2 <= local_28) break;
    this_01 = (Employee *)operator_new(0xb8);
    Employee::Employee(this_01,obj->employees[local_28]);
    this->employees[local_28] = this_01;
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

Company::Company(const Company &obj) {
    this->budget = obj.budget;
    this->boss = new Boss(*obj.boss);
    this->employees = new Employee *[obj.boss->getNumberOfEmployees()];
    for (int i = 0; i < obj.boss->getNumberOfEmployees(); ++i) {
        this->employees[i] = new Employee(*obj.employees[i]);
    }
}